

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::create
          (Image *this,DeviceInterface *vk,VkDevice device,VkImageCreateInfo *createInfo)

{
  VkFormat VVar1;
  Allocation *pAVar2;
  undefined8 *puVar3;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Image> SVar4;
  Move<vk::Handle<(vk::HandleType)9>_> local_68;
  _func_int **local_48;
  undefined8 uStack_40;
  
  pAVar2 = (Allocation *)operator_new(0x70);
  VVar1 = createInfo->format;
  local_48 = *(_func_int ***)&createInfo->mipLevels;
  uStack_40 = 0;
  ::vk::createImage(&local_68,vk,device,createInfo,(VkAllocationCallbacks *)0x0);
  pAVar2->_vptr_Allocation = (_func_int **)0x0;
  pAVar2[1]._vptr_Allocation =
       (_func_int **)local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pAVar2[1].m_memory.m_internal =
       (deUint64)local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  pAVar2->m_offset = local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  pAVar2->m_hostPtr =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  *(VkFormat *)&pAVar2[1].m_offset = VVar1;
  *(undefined8 *)((long)&pAVar2[1].m_offset + 4) = *(undefined8 *)&createInfo->extent;
  *(deUint32 *)((long)&pAVar2[1].m_hostPtr + 4) = (createInfo->extent).depth;
  pAVar2[2]._vptr_Allocation = local_48;
  pAVar2[2].m_memory.m_internal = 0;
  pAVar2[2].m_offset = 0;
  pAVar2[2].m_hostPtr = (void *)0x0;
  pAVar2[3]._vptr_Allocation = (_func_int **)vk;
  pAVar2[3].m_memory.m_internal = (deUint64)device;
  *(undefined8 *)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = 0;
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = pAVar2;
  puVar3 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar3 + 1) = 0;
  *(undefined4 *)((long)puVar3 + 0xc) = 0;
  *puVar3 = &PTR__SharedPtrState_00cfcd58;
  puVar3[2] = pAVar2;
  *(undefined8 **)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = puVar3;
  *(undefined4 *)(puVar3 + 1) = 1;
  *(undefined4 *)((long)puVar3 + 0xc) = 1;
  SVar4.m_state = extraout_RDX;
  SVar4.m_ptr = this;
  return SVar4;
}

Assistant:

de::SharedPtr<Image> Image::create(const vk::DeviceInterface&	vk,
								   vk::VkDevice					device,
								   const vk::VkImageCreateInfo	&createInfo)
{
	return de::SharedPtr<Image>(new Image(vk, device, createInfo.format, createInfo.extent,
								createInfo.mipLevels, createInfo.arrayLayers,
								vk::createImage(vk, device, &createInfo)));
}